

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

FilePath * __thiscall testing::internal::FilePath::RemoveFileName(FilePath *this)

{
  char *pcVar1;
  ulong uVar2;
  FilePath *in_RDI;
  string dir;
  char *last_sep;
  FilePath *in_stack_ffffffffffffff60;
  allocator *paVar3;
  string *in_stack_ffffffffffffff68;
  FilePath *in_stack_ffffffffffffff70;
  allocator local_65 [13];
  string local_58 [32];
  string local_38 [32];
  char *local_18;
  
  local_18 = FindLastPathSeparator(in_stack_ffffffffffffff60);
  std::__cxx11::string::string(local_38);
  if (local_18 == (char *)0x0) {
    std::__cxx11::string::operator=(local_38,"./");
  }
  else {
    pcVar1 = c_str((FilePath *)0x1279f1);
    in_stack_ffffffffffffff68 = (string *)(local_18 + 1);
    in_stack_ffffffffffffff70 = (FilePath *)c_str((FilePath *)0x127a12);
    uVar2 = (long)in_stack_ffffffffffffff68 - (long)in_stack_ffffffffffffff70;
    paVar3 = local_65;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar1,uVar2,paVar3);
    std::__cxx11::string::operator=(local_38,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)local_65);
  }
  FilePath(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  std::string dir;
  if (last_sep) {
    dir = std::string(c_str(), static_cast<size_t>(last_sep + 1 - c_str()));
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}